

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

size_t rtosc_print_arg_val(rtosc_arg_val_t *arg,char *buffer,size_t bs,rtosc_print_options *opt,
                          int *cols_used,rtosc_arg_val_t *prev_arg_if_range)

{
  rtosc_arg_t *arg_00;
  _Bool _Var1;
  byte bVar2;
  int _n2;
  int32_t iVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  uint uVar7;
  undefined1 *opt_00;
  ushort **ppuVar8;
  size_t sVar9;
  tm_conflict *__tp;
  uint64_t uVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  rtosc_arg_val_t *prVar17;
  ulong uVar18;
  ulong uVar19;
  rtosc_arg_val_t *prev_arg_if_range_00;
  ulong uVar20;
  char cVar21;
  rtosc_arg_val_t *arg_01;
  long lVar22;
  int32_t i;
  char *pcVar23;
  bool bVar24;
  float fVar25;
  char *pcStack_f0;
  undefined1 local_e8 [8];
  rtosc_arg_val_t second;
  rtosc_arg_val_t m_one;
  undefined1 local_88 [8];
  char fmtstr [9];
  char *local_70;
  char *local_68;
  char *local_50;
  
  opt_00 = _compoundliteral;
  if (opt != (rtosc_print_options *)0x0) {
    opt_00 = &opt->lossless;
  }
  arg_00 = &arg->val;
  bVar2 = arg->type;
  local_68 = (char *)0x0;
  switch(bVar2) {
  case 0x61:
    pcStack_f0 = (char *)0x10a844;
    uVar5 = rtosc_arg_arr_len(arg_00);
    lVar14 = -((ulong)uVar5 * 0x18 + 0xf & 0xfffffffffffffff0);
    *buffer = '[';
    *cols_used = *cols_used + 1;
    *(undefined8 *)(local_e8 + lVar14 + -8) = 0x10a87f;
    iVar3 = rtosc_arg_arr_len(arg_00);
    if (iVar3 == 0) {
      buffer[1] = ' ';
      *cols_used = *cols_used + 1;
      local_50 = buffer + 2;
      *(undefined8 *)(local_e8 + lVar14 + -8) = 2;
      local_68 = *(char **)(local_e8 + lVar14 + -8);
    }
    else {
      local_50 = buffer + 1;
      pcVar23 = buffer + -1;
      *(undefined8 *)(local_e8 + lVar14 + -8) = 1;
      uVar15 = *(ulong *)(local_e8 + lVar14 + -8);
      *(undefined8 *)(local_e8 + lVar14 + -8) = 1;
      local_68 = *(char **)(local_e8 + lVar14 + -8);
      local_70._0_4_ = (int)uVar15;
      while( true ) {
        *(undefined8 *)(local_e8 + lVar14 + -8) = 0x10a8ad;
        iVar3 = rtosc_arg_arr_len(arg_00);
        iVar4 = (int)uVar15;
        if (iVar3 < iVar4) break;
        prVar17 = arg + iVar4;
        *(undefined8 *)(local_e8 + lVar14 + -8) = 0x10a8de;
        iVar3 = rtosc_arg_arr_len(arg_00);
        *(undefined8 *)(local_e8 + lVar14 + -8) = 0x10a8ff;
        iVar3 = rtosc_convert_to_range
                          (prVar17,(long)((iVar3 - iVar4) + 1),
                           (rtosc_arg_val_t *)(local_e8 + lVar14),(rtosc_print_options *)opt_00);
        arg_01 = (rtosc_arg_val_t *)(local_e8 + lVar14);
        if (iVar3 == 0) {
          arg_01 = prVar17;
        }
        prev_arg_if_range_00 = arg + (long)iVar4 + -1;
        if (iVar4 == 1) {
          prev_arg_if_range_00 = (rtosc_arg_val_t *)0x0;
        }
        *(undefined8 *)(local_e8 + lVar14 + -8) = 0x10a955;
        sVar9 = rtosc_print_arg_val(arg_01,local_50,bs - 1,(rtosc_print_options *)opt_00,cols_used,
                                    prev_arg_if_range_00);
        if (iVar3 == 0) {
          *(undefined8 *)(local_e8 + lVar14 + -8) = 0x10a96e;
          iVar3 = next_arg_offset(prVar17);
        }
        lVar22 = (long)(int)sVar9;
        bs = (bs - 1) - lVar22;
        local_68 = local_68 + lVar22;
        if ((int)local_70 < 1 || *cols_used <= ((rtosc_print_options *)opt_00)->linelength) {
          local_70._0_4_ = (int)local_70 + 1;
          pcVar23 = local_50 + lVar22;
        }
        else {
          *pcVar23 = '\n';
          *(undefined8 *)(local_e8 + lVar14 + -8) = 0x10a9c2;
          memmove(pcVar23 + 5,pcVar23 + 1,sVar9 + 1);
          pcVar23[1] = ' ';
          pcVar23[2] = ' ';
          pcVar23[3] = ' ';
          pcVar23[4] = ' ';
          *cols_used = (int)sVar9 + 4;
          local_68 = local_68 + 4;
          bs = bs - 4;
          *(undefined8 *)(local_e8 + lVar14 + -8) = 1;
          local_70._0_4_ = (int)*(undefined8 *)(local_e8 + lVar14 + -8);
          pcVar23 = local_50 + lVar22 + 4;
        }
        uVar15 = (ulong)(uint)(iVar4 + iVar3);
        local_50 = pcVar23 + 1;
        *pcVar23 = ' ';
        local_68 = local_68 + 1;
        *cols_used = *cols_used + 1;
      }
    }
    local_50[-1] = ']';
    local_50[0] = '\0';
    *cols_used = *cols_used + 1;
    break;
  case 0x62:
    pcStack_f0 = (char *)0x10a784;
    iVar4 = asnprintf(buffer,bs,"BLOB [%d ",(ulong)(uint)(arg->val).i);
    local_68 = (char *)(long)iVar4;
    iVar4 = *cols_used + iVar4;
    *cols_used = iVar4;
    pcVar23 = buffer + (long)local_68;
    for (lVar14 = 0; lVar14 < arg_00->i; lVar14 = lVar14 + 1) {
      if (((rtosc_print_options *)opt_00)->linelength + -6 <= iVar4) {
        pcStack_f0 = (char *)0x10a7d7;
        iVar4 = asnprintf(pcVar23 + -1,bs + 1,"\n    ");
        local_68 = local_68 + (long)iVar4 + -1;
        pcVar23 = pcVar23 + (long)iVar4 + -1;
        *cols_used = 4;
      }
      pcStack_f0 = (char *)0x10a810;
      asnprintf(pcVar23,bs,"0x%02x ",(ulong)(arg->val).b.data[lVar14]);
      bs = bs - 5;
      pcVar23 = pcVar23 + 5;
      local_68 = local_68 + 5;
      iVar4 = *cols_used + 5;
      *cols_used = iVar4;
    }
    pcVar23[-1] = ']';
    break;
  case 99:
    uVar5 = arg_00->i;
    pcStack_f0 = (char *)0x10a732;
    uVar7 = as_escaped_char(uVar5,1);
    pcVar23 = "\\";
    if (uVar7 == 0xffffffff) {
      pcVar23 = "";
      uVar7 = uVar5;
    }
    pcStack_f0 = (char *)0x10a762;
    iVar4 = asnprintf(buffer,bs,"\'%s%c\'",pcVar23,(ulong)uVar7);
    goto LAB_0010ab1b;
  case 100:
  case 0x66:
    if (bVar2 == 0x66) {
      pcStack_f0 = (char *)0x10a621;
      asnprintf(local_88,6,"%%#.%df",
                (ulong)(uint)((rtosc_print_options *)opt_00)->floating_point_precision);
      pcStack_f0 = (char *)0x10a63f;
      iVar4 = asnprintf(buffer,bs,local_88,(double)arg_00->f);
      local_68 = (char *)(long)iVar4;
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        pcStack_f0 = (char *)0x10a66d;
        iVar4 = asnprintf(buffer + (long)local_68,bs - (long)local_68," (%a)",(double)arg_00->f);
        pcStack_f0 = (char *)0x10a680;
        sVar9 = remove_trailing_zeroes(buffer + (long)(local_68 + 2));
        local_68 = local_68 + ((long)iVar4 - sVar9);
      }
    }
    else {
      pcStack_f0 = (char *)0x10aa35;
      asnprintf(local_88,8,"%%#.%dlfd",
                (ulong)(uint)((rtosc_print_options *)opt_00)->floating_point_precision);
      pcStack_f0 = (char *)0x10aa53;
      iVar4 = asnprintf(buffer,bs,local_88,arg_00->d);
      local_68 = (char *)(long)iVar4;
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        pcStack_f0 = (char *)0x10aa7f;
        iVar4 = asnprintf(buffer + (long)local_68,bs - (long)local_68," (%la)",arg_00->d);
        local_68 = local_68 + iVar4;
      }
    }
    break;
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
    goto switchD_0010a5f7_caseD_65;
  case 0x68:
    pcStack_f0 = (char *)0x10aaf4;
    iVar4 = asnprintf(buffer,bs,"%ldh",arg_00->d);
    goto LAB_0010ab1b;
  case 0x69:
    pcStack_f0 = (char *)0x10a71d;
    iVar4 = asnprintf(buffer,bs,"%d",(ulong)(uint)arg_00->i);
    goto LAB_0010ab1b;
  case 0x6d:
    uVar15 = (ulong)(arg->val).m[0];
    uVar18 = (ulong)(arg->val).m[1];
    uVar19 = (ulong)(arg->val).m[2];
    uVar20 = (ulong)(arg->val).m[3];
    pcVar23 = "MIDI [0x%02x 0x%02x 0x%02x 0x%02x]";
    goto LAB_0010aac4;
  case 0x72:
    uVar5 = arg_00->i;
    uVar15 = (ulong)(uVar5 >> 0x18);
    uVar18 = (ulong)(uVar5 >> 0x10 & 0xff);
    uVar19 = (ulong)(uVar5 >> 8 & 0xff);
    uVar20 = (ulong)(uVar5 & 0xff);
    pcVar23 = "#%02x%02x%02x%02x";
LAB_0010aac4:
    iVar4 = asnprintf(buffer,bs,pcVar23,uVar15,uVar18,uVar19,uVar20);
LAB_0010ab1b:
    local_68 = (char *)(long)iVar4;
    break;
  case 0x73:
switchD_0010a5f7_caseD_73:
LAB_0010aca2:
    local_88 = (undefined1  [8])(buffer + 1);
    *buffer = '\"';
    *cols_used = *cols_used + 1;
    pcVar23 = arg_00->s;
    bVar24 = false;
LAB_0010acbd:
    for (; cVar21 = *pcVar23, cVar21 != '\0'; pcVar23 = pcVar23 + 1) {
      if ((!bVar24) && (((rtosc_print_options *)opt_00)->linelength + -3 < *cols_used)) {
        pcStack_f0 = (char *)0x10acf7;
        break_string((char **)local_88,bs,cols_used);
        cVar21 = *pcVar23;
      }
      pcStack_f0 = (char *)0x10ad05;
      iVar4 = as_escaped_char((int)cVar21,0);
      if (iVar4 == -1) {
        *(char *)local_88 = cVar21;
        *cols_used = *cols_used + 1;
        local_88 = (undefined1  [8])((long)local_88 + 1);
      }
      else {
        *(char *)local_88 = '\\';
        pcVar16 = (char *)((long)local_88 + 2);
        *(char *)((long)local_88 + 1) = (char)iVar4;
        *cols_used = *cols_used + 2;
        local_88 = (undefined1  [8])pcVar16;
        if (iVar4 == 0x6e && !bVar24) {
          pcStack_f0 = (char *)0x10ad39;
          break_string((char **)local_88,bs,cols_used);
        }
      }
    }
    if (!bVar24) {
      *(char *)local_88 = '\"';
      *cols_used = *cols_used + 1;
      if (arg->type == 'S') {
        *(char *)((long)local_88 + 1) = 'S';
        local_88 = (undefined1  [8])((long)local_88 + 2);
      }
      else {
        local_88 = (undefined1  [8])((long)local_88 + 1);
      }
    }
    *(char *)local_88 = '\0';
    local_68 = (char *)((long)local_88 + -(long)buffer);
    break;
  case 0x74:
    pcStack_f0 = (char *)0x10aafe;
    _Var1 = rtosc_arg_val_is_immediatelly(arg);
    if (_Var1) {
      pcStack_f0 = (char *)0x10ab1b;
      iVar4 = asnprintf(buffer,bs,"immediately");
      goto LAB_0010ab1b;
    }
    pcStack_f0 = (char *)0x10adb0;
    __tp = rtosc_params_from_arg_val(arg);
    pcStack_f0 = (char *)0x10adbb;
    uVar10 = rtosc_secfracs_from_arg_val(arg);
    if ((int)uVar10 == 0) {
      if (__tp->tm_sec == 0) {
        if (__tp->tm_hour == 0) {
          pcVar23 = "%Y-%m-%d %H:%M";
          if (__tp->tm_min == 0) {
            pcVar23 = "%Y-%m-%d";
          }
        }
        else {
          pcVar23 = "%Y-%m-%d %H:%M";
        }
      }
      else {
        pcVar23 = "%Y-%m-%d %H:%M:%S";
      }
      pcStack_f0 = (char *)0x10b298;
      local_68 = (char *)strftime(buffer,bs,pcVar23,(tm *)__tp);
    }
    else {
      pcStack_f0 = (char *)0x10addd;
      sVar11 = strftime(buffer,bs,"%Y-%m-%d %H:%M:%S",(tm *)__tp);
      uVar5 = ((rtosc_print_options *)opt_00)->floating_point_precision;
      pcStack_f0 = (char *)0x10adf0;
      fVar25 = rtosc_secfracs2float((long)(int)uVar10);
      pcStack_f0 = (char *)0x10ae10;
      asnprintf(local_88,5,"%%.%df",(ulong)uVar5);
      pcStack_f0 = (char *)0x10ae36;
      iVar4 = asnprintf(buffer + sVar11,bs - sVar11,local_88);
      local_68 = buffer + (int)sVar11;
      pcStack_f0 = (char *)0x10ae4e;
      pcVar23 = strchr(local_68,0x2e);
      pcStack_f0 = (char *)0x10ae59;
      sVar12 = strlen(pcVar23);
      pcStack_f0 = (char *)0x10ae68;
      memmove(local_68,pcVar23,sVar12 + 1);
      local_68 = local_68 + (((long)iVar4 + sVar11) - (long)pcVar23);
      if (((rtosc_print_options *)opt_00)->lossless == true) {
        pcStack_f0 = (char *)0x10aea3;
        iVar4 = asnprintf(buffer + (long)local_68,bs - (long)local_68," (...+%as)",(double)fVar25);
        pcStack_f0 = (char *)0x10aeb6;
        sVar9 = remove_trailing_zeroes(buffer + (long)(local_68 + 6));
        local_68 = local_68 + ((long)iVar4 - sVar9);
      }
    }
    break;
  default:
    if (bVar2 == 0x2d) {
      if (((rtosc_print_options *)opt_00)->compress_ranges == 0) {
        pcStack_f0 = (char *)0x10aefa;
        iVar3 = rtosc_arg_rep_num(arg_00);
        if (iVar3 == 0) goto LAB_0010aba4;
        local_50 = (char *)0x0;
        iVar3 = 0;
      }
      else {
LAB_0010aba4:
        pcStack_f0 = (char *)0x10abac;
        iVar3 = rtosc_arg_rep_has_delta(arg_00);
        if (iVar3 == 0) {
          pcStack_f0 = (char *)0x10af1a;
          iVar3 = rtosc_arg_rep_num(arg_00);
          if (iVar3 != 0) {
            pcStack_f0 = (char *)0x10af2a;
            uVar5 = rtosc_arg_rep_num(arg_00);
            pcStack_f0 = (char *)0x10af40;
            iVar4 = asnprintf(buffer,bs,"%dx",(ulong)uVar5);
            lVar22 = (long)iVar4;
            *cols_used = *cols_used + iVar4;
            pcStack_f0 = (char *)0x10af71;
            sVar9 = rtosc_print_arg_val(arg + 1,buffer + lVar22,bs - lVar22,
                                        (rtosc_print_options *)opt_00,cols_used,
                                        (rtosc_arg_val_t *)0x0);
            lVar14 = (long)(int)sVar9;
            bs = (bs - lVar22) - lVar14;
            buffer = buffer + lVar22 + lVar14;
            local_50 = (char *)(lVar14 + lVar22);
            pcStack_f0 = (char *)0x10af8f;
            iVar3 = rtosc_arg_rep_num(arg_00);
            goto LAB_0010b0cb;
          }
        }
        pcStack_f0 = (char *)0x10abbc;
        iVar3 = rtosc_arg_rep_has_delta(arg_00);
        prVar17 = arg + (ulong)(iVar3 != 0) + 1;
        pcStack_f0 = (char *)0x10abeb;
        sVar9 = rtosc_print_arg_val(prVar17,buffer,bs,(rtosc_print_options *)opt_00,cols_used,
                                    (rtosc_arg_val_t *)0x0);
        local_50 = (char *)(long)(int)sVar9;
        sVar9 = bs - (long)local_50;
        pcVar23 = buffer + (long)local_50;
        pcStack_f0 = (char *)0x10ac01;
        iVar3 = rtosc_arg_rep_has_delta(arg_00);
        if (iVar3 != 0) {
          pcStack_f0 = (char *)0x10ac22;
          rtosc_arg_val_from_int((rtosc_arg_val_t *)local_88,prVar17->type,1);
          pcStack_f0 = (char *)0x10ac35;
          rtosc_arg_val_from_int((rtosc_arg_val_t *)((long)&second.val + 8),prVar17->type,-1);
          if ((prev_arg_if_range == (rtosc_arg_val_t *)0x0) ||
             (prev_arg_if_range->type != prVar17->type)) {
            bVar24 = false;
          }
          else {
            pcStack_f0 = (char *)0x10ac57;
            iVar4 = rtosc_arg_vals_eq_single(prVar17,prev_arg_if_range,(rtosc_cmp_options *)0x0);
            bVar24 = iVar4 == 0;
          }
          pcStack_f0 = (char *)0x10afaf;
          iVar4 = rtosc_arg_vals_eq_single
                            (arg + 1,(rtosc_arg_val_t *)local_88,(rtosc_cmp_options *)0x0);
          if (iVar4 == 0) {
            pcStack_f0 = (char *)0x10afe1;
            iVar4 = rtosc_arg_vals_eq_single
                              (arg + 1,(rtosc_arg_val_t *)((long)&second.val + 8),
                               (rtosc_cmp_options *)0x0);
            bVar24 = (bool)(iVar4 == 0 | bVar24);
          }
          if (bVar24) {
            pcStack_f0 = (char *)0x10affe;
            iVar3 = rtosc_arg_rep_num(arg_00);
            if (iVar3 != 0) {
              pcStack_f0 = (char *)0x10b019;
              asnprintf(pcVar23,sVar9," ");
              *cols_used = *cols_used + 1;
              pcStack_f0 = (char *)0x10b044;
              rtosc_arg_val_range_arg(arg,1,(rtosc_arg_val_t *)local_e8);
              pcStack_f0 = (char *)0x10b063;
              sVar13 = rtosc_print_arg_val((rtosc_arg_val_t *)local_e8,pcVar23 + 1,sVar9 - 1,
                                           (rtosc_print_options *)opt_00,cols_used,
                                           (rtosc_arg_val_t *)0x0);
              lVar14 = (long)(int)sVar13;
              sVar9 = (sVar9 - 1) - lVar14;
              pcVar23 = pcVar23 + lVar14 + 1;
              local_50 = (char *)((long)local_50 + lVar14 + 1);
            }
          }
        }
        pcStack_f0 = (char *)0x10b099;
        asnprintf(pcVar23,sVar9," ... ");
        bs = sVar9 - 5;
        buffer = pcVar23 + 5;
        local_50 = (char *)((long)local_50 + 5);
        *cols_used = *cols_used + 5;
        pcStack_f0 = (char *)0x10b0b5;
        iVar3 = rtosc_arg_rep_num(arg_00);
        pcStack_f0 = (char *)0x10b0c0;
        iVar6 = rtosc_arg_rep_num(arg_00);
        iVar3 = iVar3 + -1 + (uint)(iVar6 == 0);
      }
LAB_0010b0cb:
      iVar4 = iVar3;
      local_70 = buffer + -1;
      uVar5 = (uint)(cols_used != (int *)0x0);
      while( true ) {
        pcStack_f0 = (char *)0x10b0fa;
        iVar6 = rtosc_arg_rep_num(arg_00);
        if (iVar6 <= iVar4) break;
        pcStack_f0 = (char *)0x10b10f;
        iVar6 = rtosc_arg_rep_has_delta(arg_00);
        prVar17 = arg + 1;
        if (iVar6 != 0) {
          prVar17 = (rtosc_arg_val_t *)local_88;
          pcStack_f0 = (char *)0x10b12c;
          rtosc_arg_val_range_arg(arg,iVar4,prVar17);
        }
        pcStack_f0 = (char *)0x10b14b;
        sVar9 = rtosc_print_arg_val(prVar17,buffer,bs,(rtosc_print_options *)opt_00,cols_used,
                                    (rtosc_arg_val_t *)0x0);
        lVar14 = (long)(int)sVar9;
        lVar22 = bs - lVar14;
        pcVar23 = buffer + lVar14;
        lVar14 = (long)local_50 + lVar14;
        uVar7 = uVar5 + 1;
        if ((((rtosc_print_options *)opt_00)->linelength < *cols_used) && (0 < (int)uVar5)) {
          *local_70 = '\n';
          pcStack_f0 = (char *)0x10b19a;
          memmove(local_70 + 5,local_70 + 1,sVar9 + 1);
          local_70[1] = ' ';
          local_70[2] = ' ';
          local_70[3] = ' ';
          local_70[4] = ' ';
          *cols_used = (int)sVar9 + 4;
          lVar14 = lVar14 + 4;
          pcVar23 = pcVar23 + 4;
          lVar22 = lVar22 + -4;
          uVar7 = 1;
        }
        buffer = pcVar23 + 1;
        *pcVar23 = ' ';
        *cols_used = *cols_used + 1;
        bs = lVar22 - 1;
        local_50 = (char *)(lVar14 + 1);
        iVar4 = iVar4 + 1;
        local_70 = pcVar23;
        uVar5 = uVar7;
      }
      pcStack_f0 = (char *)0x10b20c;
      iVar6 = rtosc_arg_rep_num(arg_00);
      iVar4 = (int)local_50;
      if (iVar3 < iVar6) {
        buffer[-1] = '\0';
        iVar4 = iVar4 + -1;
      }
      local_68 = (char *)(long)iVar4;
    }
    else if (bVar2 == 0x46) {
      pcStack_f0 = (char *)0x10ab8b;
      fast_strcpy(buffer,"false",bs);
      pcStack_f0 = (char *)0x5;
      local_68 = pcStack_f0;
    }
    else {
      if (bVar2 == 0x49) {
        pcVar23 = "inf";
      }
      else {
        if (bVar2 != 0x4e) {
          if (bVar2 == 0x53) {
            pcVar23 = arg_00->s;
            cVar21 = *pcVar23;
            if ((long)cVar21 != 0x5f) {
              pcStack_f0 = (char *)0x10ab4c;
              ppuVar8 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar8 + (long)cVar21 * 2 + 1) & 4) == 0)
              goto switchD_0010a5f7_caseD_73;
            }
            bVar2 = 1;
            pcVar16 = pcVar23;
            while( true ) {
              pcVar16 = pcVar16 + 1;
              cVar21 = *pcVar16;
              if (((long)cVar21 == 0) || (bVar2 == 0)) break;
              bVar2 = 1;
              if (cVar21 != '_') {
                pcStack_f0 = (char *)0x10ac82;
                ppuVar8 = __ctype_b_loc();
                bVar2 = ((byte)(*ppuVar8)[cVar21] & 8) >> 3;
              }
            }
            bVar24 = true;
            local_88 = (undefined1  [8])buffer;
            if (bVar2 == 0) goto LAB_0010aca2;
            goto LAB_0010acbd;
          }
          if (bVar2 != 0x54) goto switchD_0010a5f7_caseD_65;
          pcStack_f0 = (char *)0x10a6d3;
          fast_strcpy(buffer,"true",bs);
          pcStack_f0 = (char *)0x4;
          local_68 = pcStack_f0;
          break;
        }
        pcVar23 = "nil";
      }
      pcStack_f0 = (char *)0x10ab75;
      fast_strcpy(buffer,pcVar23,bs);
      pcStack_f0 = (char *)0x3;
      local_68 = pcStack_f0;
    }
  }
  bVar2 = arg->type;
switchD_0010a5f7_caseD_65:
  if (((0x20 < bVar2 - 0x53) || ((0x10000c001U >> ((ulong)(bVar2 - 0x53) & 0x3f) & 1) == 0)) &&
     (bVar2 != 0x2d)) {
    *cols_used = *cols_used + (int)local_68;
  }
  return (size_t)local_68;
}

Assistant:

size_t rtosc_print_arg_val(const rtosc_arg_val_t *arg,
                           char *buffer, size_t bs,
                           const rtosc_print_options* opt, int *cols_used, const rtosc_arg_val_t* prev_arg_if_range)
{
    size_t wrt = 0;
    if(!opt)
        opt = default_print_options;
    assert(arg);
    const rtosc_arg_t* val = &arg->val;

    switch(arg->type)
    {
        case 'T':
            assert(bs>4);
            fast_strcpy(buffer, "true", bs);
            wrt = 4;
            break;
        case 'F':
            assert(bs>5);
            fast_strcpy(buffer, "false", bs);
            wrt = 5;
            break;
        case 'N':
            assert(bs>3);
            fast_strcpy(buffer, "nil", bs);
            wrt = 3;
            break;
        case 'I':
            assert(bs>3);
            fast_strcpy(buffer, "inf", bs);
            wrt = 3;
            break;
        case 'h':
            wrt = asnprintf(buffer, bs, "%"PRId64"h", val->h);
            break;
        case 't': // write to ISO 8601 date
        {
            if(rtosc_arg_val_is_immediatelly(arg))
                wrt = asnprintf(buffer, bs, "immediately");
            else
            {
                struct tm* m_tm = rtosc_params_from_arg_val(arg);
                int32_t secfracs = rtosc_secfracs_from_arg_val(arg);

                const char* strtimefmt = (secfracs || m_tm->tm_sec)
                                  ? "%Y-%m-%d %H:%M:%S"
                                  : (m_tm->tm_hour || m_tm->tm_min)
                                    ? "%Y-%m-%d %H:%M"
                                    : "%Y-%m-%d";

                wrt = strftime(buffer, bs, strtimefmt, m_tm);
                assert(wrt);

                if(secfracs)
                {
                    int prec = opt->floating_point_precision;
                    assert(prec>=0);
                    assert(prec<100);

                    // convert fractions -> float
                    float flt = rtosc_secfracs2float(secfracs);

                    // append float
                    char fmtstr[8];
                    asnprintf(fmtstr, 5, "%%.%df", prec);
                    int lastwrt = wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     fmtstr, flt);
                    // snip part before separator
                    const char* sep = strchr(buffer + lastwrt, '.');
                    assert(sep);
                    memmove(buffer + lastwrt, sep, strlen(sep)+1);
                    wrt -= (sep - (buffer + lastwrt));

                    if(opt->lossless) {
                        char* last_pos = buffer + wrt;
                        wrt += asnprintf(buffer + wrt, bs - wrt,
                                         " (...+%as)", flt);
                        wrt -= remove_trailing_zeroes(last_pos+6);
                    }
                } // if secfracs
            } // else
            break;
        }
        case 'r':
            wrt = asnprintf(buffer, bs, "#%02x%02x%02x%02x",
                      (val->i >> 24) & 0xff,
                      (val->i >> 16) & 0xff,
                      (val->i >>  8) & 0xff,
                       val->i        & 0xff
                      );
            break;
        case 'd':
        case 'f':
        {
            int prec = opt->floating_point_precision;
            assert(prec>=0);
            assert(prec<100);
            char fmtstr[9];
            if(arg->type == 'f')
            {
                // e.g. "%.42f" or "%.0f.":
                asnprintf(fmtstr, 6, "%%#.%df", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->f);
                if(opt->lossless)
                {
                    char* last_pos = buffer + wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%a)", val->f);
                    wrt -= remove_trailing_zeroes(last_pos+2);
                }
            }
            else
            {
                // e.g. "%.42lfd" or "%.0lf.d"
                asnprintf(fmtstr, 8, "%%#.%dlfd", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->d);
                if(opt->lossless)
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%la)", val->d);
            }
            break;
        }
        case 'c':
        {
            int is_esc = (as_escaped_char(val->i, true) != -1);
            wrt = asnprintf(buffer, bs, "'%s%c'",
                            is_esc ? "\\" : "",
                            is_esc ? as_escaped_char(val->i, true)
                                   : val->i);
            break;
        }
        case 'i':
            wrt = asnprintf(buffer, bs, "%"PRId32, val->i);
            break;
        case 'm':
            wrt = asnprintf(buffer, bs, "MIDI [0x%02x 0x%02x 0x%02x 0x%02x]",
                            val->m[0], val->m[1], val->m[2], val->m[3]);
            break;
        case 's':
        case 'S':
        {
            bool plain; // e.g. without quotes
            if(arg->type == 'S')
            {
                plain = true; // "Symbol": are quotes required?
                if(*val->s != '_' && !isalpha(*val->s))
                    plain = false;
                else for(const char* s = val->s + 1; *s && plain; ++s)
                    plain = (*s == '_' || (isalnum(*s)));
            }
            else plain = false;

            char* b = buffer;
            if(!plain)
            {
                *b++ = '"';
                ++*cols_used;
            }
            for(const char* s = val->s; *s; ++s)
            {
                // "3": 2 quote signs and escaping backslash
                if(!plain && *cols_used > opt->linelength - 3)
                    break_string(&b, bs, cols_used);
                assert(bs);
                int as_esc = as_escaped_char(*s, false);
                if(as_esc != -1) {
                    assert(bs-1);
                    *b++ = '\\';
                    *b++ = as_esc;
                    *cols_used += 2;
                    if(!plain && as_esc == 'n')
                        break_string(&b, bs, cols_used);
                }
                else {
                    *b++ = *s;
                    ++*cols_used;
                }
            }

            if(plain)
                assert(bs);
            else
            {
                assert(bs >= 2);
                *b++ = '"';
                ++*cols_used;
                if(arg->type == 'S') {
                    assert(bs >= 2);
                    *b++ = 'S';
                }
            }
            *b = 0;
            wrt += (b-buffer);
            break;
        }
        case 'b':
            wrt = asnprintf(buffer, bs, "BLOB [%d ", val->b.len);
            *cols_used += wrt;
            buffer += wrt;
            for(int32_t i = 0; i < val->b.len; ++i)
            {
                if(*cols_used >= opt->linelength - 6)
                {
                    int tmp = asnprintf(buffer-1, bs+1, "\n    ");
                    wrt += (tmp-1);
                    buffer += (tmp-1);
                    *cols_used = 4;
                }
                asnprintf(buffer, bs, "0x%02x ", val->b.data[i]);
                COUNT_UP_COL(5);
            }
            buffer[-1] = ']';
            break;
        case 'a':
        {
            char* last_sep = buffer - 1;
            int args_written_this_line = (cols_used) ? 1 : 0;
            STACKALLOC(rtosc_arg_val_t, args_converted, rtosc_arg_arr_len(val)); // range conversion

            COUNT_UP_WRITE('[');
            if(rtosc_arg_arr_len(val))
            for(int32_t i = 1; i <= rtosc_arg_arr_len(val); )
            {
                int32_t conv = rtosc_convert_to_range(arg+i, rtosc_arg_arr_len(val)+1-i, args_converted, opt);
                const rtosc_arg_val_t* input = conv ? args_converted : arg+i;

                size_t tmp = rtosc_print_arg_val(input, buffer, bs,
                                                 opt, cols_used, (i == 1) ? NULL : arg + i -1);
                i += conv ? conv : next_arg_offset(arg+i);
                COUNT_UP(tmp);

                linebreak_check_after_write(cols_used, &wrt,
                                            last_sep, &buffer, &bs,
                                            tmp, &args_written_this_line,
                                            opt->linelength);

                last_sep = buffer;
                COUNT_UP_WRITE(' ');
            }
            else
                COUNT_UP_WRITE(' ');

            assert(bs);
            buffer[-1] = ']';
            *buffer = 0;
            ++*cols_used;
            --bs;
            break;
        }
        case '-':
        {
            wrt += rtosc_print_range(arg, buffer, bs, opt, cols_used, prev_arg_if_range);
            break;
        }
        default:
            ;
    }

    switch(arg->type)
    {
        case '-':
        case 'a':
        case 's':
        case 'S':
        case 'b':
            // these can break the line, so they compute *cols_used themselves
            break;
        default:
            *cols_used += wrt;
    }

    return wrt;
}